

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iFrame;
  int i;
  uint uVar4;
  
  if (0 < p->nFrames) {
    uVar3 = 0;
    while( true ) {
      p_00 = p->pAig->vCis;
      if (p_00->nSize <= (int)uVar3) break;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,uVar3);
      Ssw_SmlObjAssignConst(p,pAVar2,(uint)((pPat[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0),0);
      uVar3 = uVar3 + 1;
    }
    uVar3 = p->pAig->nTruePis;
    uVar4 = p->nWordsFrame * 0x20 - 1;
    if ((int)uVar3 < (int)uVar4) {
      uVar4 = uVar3;
    }
    uVar3 = 0;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    iFrame = 1;
    while (uVar4 != uVar3) {
      pAVar2 = Aig_ManCi(p->pAig,uVar3);
      uVar3 = uVar3 + 1;
      puVar1 = (uint *)((long)&p[1].pAig +
                       (ulong)(uVar3 >> 5) * 4 + (long)p->nWordsTotal * (long)pAVar2->Id * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar3 & 0x1f);
    }
    for (; iFrame < p->nFrames; iFrame = iFrame + 1) {
      for (i = 0; i < p->pAig->nTruePis; i = i + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,i);
        Ssw_SmlAssignRandomFrame(p,pAVar2,iFrame);
      }
    }
    return;
  }
  __assert_fail("p->nFrames > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                ,0x2a6,"void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *, unsigned int *)");
}

Assistant:

void Ssw_SmlAssignDist1Plus( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, Limit;
    assert( p->nFrames > 0 );

    // copy the pattern into the primary inputs
    Aig_ManForEachCi( p->pAig, pObj, i )
        Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );

    // set distance one PIs for the first frame
    Limit = Abc_MinInt( Saig_ManPiNum(p->pAig), p->nWordsFrame * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ), i+1 );

    // create random info for the remaining timeframes
    for ( f = 1; f < p->nFrames; f++ )
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p, pObj, f );
}